

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O2

MPP_RET store_picture_in_dpb(H264_DpbBuf_t *p_Dpb,H264_StorePic_t *p)

{
  H264dVideoCtx_t *p_Vid;
  H264_DpbMark_t *p_mark;
  h264_dec_ctx_t *phVar1;
  H264_DecCtx_t *p_Dec;
  h264_store_pic_t *phVar2;
  MPP_RET MVar3;
  RK_U32 RVar4;
  RK_S32 RVar5;
  h264_frame_store_t *phVar6;
  h264_store_pic_t *phVar7;
  int iVar8;
  char *pcVar9;
  H264_FrameStore_t *pHVar10;
  RK_U32 i;
  int iVar11;
  ulong uVar12;
  h264_drpm_t *phVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  H264_StorePic_t *p_00;
  uint uVar17;
  undefined8 uVar18;
  int iVar19;
  RK_S32 min_poc;
  h264d_video_ctx_t *local_48;
  undefined8 local_40;
  RK_S32 local_34;
  
  p_Vid = p_Dpb->p_Vid;
  if (p == (H264_StorePic_t *)0x0) {
    MVar3 = MPP_ERR_VALUE;
    if (((byte)h264d_debug & 4) == 0) goto LAB_0018d525;
    pcVar9 = "value error(%d).\n";
    uVar18 = 0x59d;
  }
  else {
    pcVar9 = (char *)p;
    if (p->mem_mark == (h264_dpb_mark_t *)0x0) {
LAB_0018d471:
      if (((byte)h264d_debug & 1) != 0) {
        pcVar9 = "h264d_dpb";
        _mpp_log_l(4,"h264d_dpb","error, p->mem_mark == NULL",(char *)0x0);
      }
    }
    else {
      uVar17 = p->mem_mark->slot_idx;
      pcVar9 = (char *)(ulong)uVar17;
      if ((int)uVar17 < 0) goto LAB_0018d471;
      mpp_buf_slot_set_flag(p_Vid->p_Dec->frame_slots,uVar17,SLOT_CODEC_USE);
    }
    p_Vid->last_has_mmco_5 = 0;
    p_Vid->last_pic_bottom_field = (uint)(p->structure == 2);
    if (p->idr_flag == 0) {
      if ((p->used_for_reference != 0) && (p->adaptive_ref_pic_buffering_flag != 0)) {
        local_48 = p_Dpb->p_Vid;
        local_48->last_has_mmco_5 = 0;
        phVar13 = p->dec_ref_pic_marking_buffer;
        while (phVar13 != (h264_drpm_t *)0x0) {
          switch(phVar13->memory_management_control_operation) {
          case 0:
            if (phVar13->Next != (h264_drpm_t *)0x0) {
              MVar3 = MPP_ERR_VALUE;
              if (((byte)h264d_debug & 4) == 0) goto LAB_0018e247;
              pcVar9 = "value error(%d).\n";
              uVar18 = 0x42d;
              goto LAB_0018e240;
            }
            break;
          case 1:
            RVar4 = p->frame_num * 2 + 1;
            if (p->structure == 3) {
              RVar4 = p->frame_num;
            }
            iVar19 = ~phVar13->difference_of_pic_nums_minus1 + RVar4;
            for (pcVar9 = (char *)0x0;
                (h264_store_pic_t *)(ulong)p_Dpb->ref_frames_in_buffer != (h264_store_pic_t *)pcVar9
                ; pcVar9 = (char *)((long)&((h264_store_pic_t *)pcVar9)->structure + 1)) {
              p_Dec = (H264_DecCtx_t *)p_Dpb->fs_ref[(long)pcVar9];
              uVar17 = *(uint *)((long)&p_Dec->mem + 4);
              if (p->structure != 3) {
                if ((((uVar17 & 1) == 0) || (((ulong)p_Dec->dpb_mark & 1) != 0)) ||
                   (*(int *)(*(long *)&p_Dec->next_state + 0x18) != iVar19)) {
                  if ((((uVar17 & 2) == 0) || (((ulong)p_Dec->dpb_mark & 2) != 0)) ||
                     (*(int *)(*(long *)&p_Dec->mvc_valid + 0x18) != iVar19)) goto LAB_0018d7f0;
                  *(undefined4 *)(*(long *)&p_Dec->mvc_valid + 0x2c) = 0;
                  *(uint *)((long)&p_Dec->mem + 4) = uVar17 & 1;
                }
                else {
                  *(undefined4 *)(*(long *)&p_Dec->next_state + 0x2c) = 0;
                  *(uint *)((long)&p_Dec->mem + 4) = uVar17 & 2;
                }
                if (*(int *)&p_Dec->mem == 3) {
                  *(undefined4 *)(*(long *)&p_Dec->spt_decode_mtds + 0x2c) = 0;
                }
                break;
              }
              if (((uVar17 == 3) && (*(int *)&p_Dec->dpb_mark == 0)) &&
                 (*(int *)(*(long *)&p_Dec->spt_decode_mtds + 0x18) == iVar19)) {
                unmark_for_reference(p_Dec,(H264_FrameStore_t *)pcVar9);
                break;
              }
LAB_0018d7f0:
            }
            update_ref_list(p_Dpb);
            break;
          case 2:
            iVar19 = phVar13->long_term_pic_num;
            for (uVar12 = 0; uVar12 < p_Dpb->ltref_frames_in_buffer; uVar12 = uVar12 + 1) {
              pHVar10 = p_Dpb->fs_ltref[uVar12];
              uVar17 = pHVar10->is_reference;
              if (p->structure != 3) {
                if ((((uVar17 & 1) == 0) || (uVar15 = pHVar10->is_long_term, (uVar15 & 1) == 0)) ||
                   (pcVar9 = (char *)pHVar10->top_field,
                   ((h264_store_pic_t *)pcVar9)->long_term_pic_num != iVar19)) {
                  if ((((uVar17 & 2) == 0) || (uVar15 = pHVar10->is_long_term, (uVar15 & 2) == 0))
                     || (phVar7 = pHVar10->bottom_field, phVar7->long_term_pic_num != iVar19))
                  goto LAB_0018d724;
                  phVar7->used_for_reference = 0;
                  phVar7->is_long_term = '\0';
                  pHVar10->is_reference = uVar17 & 1;
                  pHVar10->is_long_term = uVar15 & 1;
                }
                else {
                  ((h264_store_pic_t *)pcVar9)->used_for_reference = 0;
                  ((h264_store_pic_t *)pcVar9)->is_long_term = '\0';
                  pHVar10->is_reference = uVar17 & 2;
                  pHVar10->is_long_term = uVar15 & 2;
                }
                if (pHVar10->is_used == 3) {
                  phVar7 = pHVar10->frame;
                  phVar7->used_for_reference = 0;
                  phVar7->is_long_term = '\0';
                }
                break;
              }
              if (((uVar17 == 3) && (pHVar10->is_long_term == 3)) &&
                 (pHVar10->frame->long_term_pic_num == iVar19)) {
                unmark_for_long_term_reference(pHVar10);
              }
LAB_0018d724:
            }
            update_ltref_list(p_Dpb);
            break;
          case 3:
            RVar4 = p->frame_num * 2 + 1;
            if (p->structure == 3) {
              RVar4 = p->frame_num;
            }
            uVar17 = phVar13->long_term_frame_idx;
            pcVar16 = (char *)(ulong)uVar17;
            iVar19 = ~phVar13->difference_of_pic_nums_minus1 + RVar4;
            if (p->structure == 3) {
              unmark_long_term_frame_for_reference_by_frame_idx(p_Dpb,uVar17);
LAB_0018d96c:
              if (p->structure == 1) {
                uVar18._0_4_ = 0;
                uVar18._4_4_ = 0;
                iVar11 = 1;
LAB_0018d9bd:
                for (uVar12 = 0; p_Dpb->ref_frames_in_buffer != uVar12; uVar12 = uVar12 + 1) {
                  phVar6 = p_Dpb->fs_ref[uVar12];
                  uVar15 = phVar6->is_reference;
                  pcVar16 = (char *)(ulong)uVar15;
                  if ((((uVar15 & 1) != 0) &&
                      (phVar7 = phVar6->top_field, phVar7->is_long_term == '\0')) &&
                     (phVar7->pic_num == iVar19)) {
                    uVar15 = phVar6->is_long_term;
                    if (uVar15 == 0) {
                      uVar15 = 0;
                    }
                    else if ((phVar6->long_term_frame_idx != uVar17) &&
                            (((byte)h264d_debug & 4) != 0)) {
                      _mpp_log_l(4,"h264d_dpb",
                                 "assigning long_term_frame_idx different from other field.",
                                 (char *)0x0);
                      phVar6 = p_Dpb->fs_ref[uVar12];
                      phVar7 = phVar6->top_field;
                      uVar15 = phVar6->is_long_term;
                    }
                    phVar7->long_term_frame_idx = uVar17;
                    phVar6->long_term_frame_idx = uVar17;
                    uVar14 = iVar11 + uVar17 * 2;
                    pcVar16 = (char *)(ulong)uVar14;
                    phVar7->long_term_pic_num = uVar14;
                    phVar7->is_long_term = '\x01';
                    phVar6->is_long_term = uVar15 | 1;
                    if ((uVar15 | 1) == 3) {
                      phVar7 = phVar6->frame;
                      phVar7->is_long_term = '\x01';
                      phVar7->long_term_pic_num = uVar17;
                      phVar7->long_term_frame_idx = uVar17;
                    }
                    goto LAB_0018da60;
                  }
                  if ((((uVar15 & 2) != 0) &&
                      (phVar7 = phVar6->bottom_field, phVar7->is_long_term == '\0')) &&
                     (phVar7->pic_num == iVar19)) {
                    uVar15 = phVar6->is_long_term;
                    if (uVar15 == 0) {
                      uVar15 = 0;
                    }
                    else if ((phVar6->long_term_frame_idx != uVar17) &&
                            (((byte)h264d_debug & 4) != 0)) {
                      local_40 = uVar18;
                      _mpp_log_l(4,"h264d_dpb",
                                 "assigning long_term_frame_idx different from other field.",
                                 (char *)0x0);
                      phVar6 = p_Dpb->fs_ref[uVar12];
                      phVar7 = phVar6->bottom_field;
                      uVar15 = phVar6->is_long_term;
                      uVar18 = local_40;
                    }
                    phVar7->long_term_frame_idx = uVar17;
                    phVar6->long_term_frame_idx = uVar17;
                    uVar14 = (int)uVar18 + uVar17 * 2;
                    pcVar16 = (char *)(ulong)uVar14;
                    phVar7->long_term_pic_num = uVar14;
                    phVar7->is_long_term = '\x01';
                    phVar6->is_long_term = uVar15 | 2;
                    if ((uVar15 | 2) == 3) {
                      phVar7 = phVar6->frame;
                      phVar7->is_long_term = '\x01';
                      phVar7->long_term_pic_num = uVar17;
                      phVar7->long_term_frame_idx = uVar17;
                    }
                    goto LAB_0018da60;
                  }
                }
                if (((byte)h264d_debug & 4) == 0) goto LAB_0018da60;
                pcVar9 = "reference field for long term marking not found.";
              }
              else {
                if (p->structure != 3) {
                  iVar11 = 0;
                  uVar18._0_4_ = 1;
                  uVar18._4_4_ = 0;
                  goto LAB_0018d9bd;
                }
                for (uVar12 = 0; p_Dpb->ref_frames_in_buffer != uVar12; uVar12 = uVar12 + 1) {
                  phVar6 = p_Dpb->fs_ref[uVar12];
                  if (((phVar6->is_reference == 3) &&
                      (pcVar16 = (char *)phVar6->frame,
                      ((h264_store_pic_t *)pcVar16)->is_long_term == '\0')) &&
                     (((h264_store_pic_t *)pcVar16)->pic_num == iVar19)) {
                    ((h264_store_pic_t *)pcVar16)->long_term_frame_idx = uVar17;
                    phVar6->long_term_frame_idx = uVar17;
                    ((h264_store_pic_t *)pcVar16)->long_term_pic_num = uVar17;
                    ((h264_store_pic_t *)pcVar16)->is_long_term = '\x01';
                    phVar7 = phVar6->top_field;
                    if ((phVar7 != (h264_store_pic_t *)0x0) &&
                       (phVar2 = phVar6->bottom_field, phVar2 != (h264_store_pic_t *)0x0)) {
                      phVar2->long_term_frame_idx = uVar17;
                      phVar7->long_term_frame_idx = uVar17;
                      phVar7->long_term_pic_num = uVar17;
                      phVar2->long_term_pic_num = uVar17;
                      pcVar16 = (char *)CONCAT71((int7)((ulong)pcVar16 >> 8),1);
                      phVar2->is_long_term = '\x01';
                      phVar7->is_long_term = '\x01';
                    }
                    phVar6->is_long_term = 3;
                    goto LAB_0018da60;
                  }
                }
                if (((byte)h264d_debug & 4) == 0) goto LAB_0018da60;
                pcVar9 = "reference frame for long term marking not found.";
              }
              pcVar16 = "h264d_dpb";
              _mpp_log_l(4,"h264d_dpb",pcVar9,(char *)0x0);
            }
            else {
              pcVar16 = pcVar9;
              for (uVar12 = 0; p_Dpb->ref_frames_in_buffer != uVar12; uVar12 = uVar12 + 1) {
                phVar6 = p_Dpb->fs_ref[uVar12];
                uVar15 = phVar6->is_reference;
                pcVar16 = (char *)(ulong)uVar15;
                if (((uVar15 & 1) != 0) && (phVar6->top_field->pic_num == iVar19)) {
                  pcVar16 = (char *)0x1;
LAB_0018d954:
                  unmark_long_term_field_for_reference_by_frame_idx
                            (p_Dpb,(RK_S32)pcVar16,uVar17,0,0,iVar19);
                  goto LAB_0018d96c;
                }
                if (((uVar15 & 2) != 0) && (phVar6->bottom_field->pic_num == iVar19)) {
                  pcVar16 = (char *)0x2;
                  goto LAB_0018d954;
                }
              }
              if (((byte)h264d_debug & 4) != 0) {
                pcVar16 = "h264d_dpb";
                _mpp_log_l(4,"h264d_dpb","value error(%d).\n",(char *)0x0,0x209);
              }
            }
LAB_0018da60:
            update_ref_list(p_Dpb);
            pcVar9 = pcVar16;
            goto LAB_0018da68;
          case 4:
            pcVar9 = (char *)(ulong)(uint)phVar13->max_long_term_frame_idx_plus1;
            mm_update_max_long_term_frame_idx(p_Dpb,phVar13->max_long_term_frame_idx_plus1);
LAB_0018da68:
            update_ltref_list(p_Dpb);
            break;
          case 5:
            for (uVar12 = 0; uVar12 < p_Dpb->ref_frames_in_buffer; uVar12 = uVar12 + 1) {
              unmark_for_reference
                        ((H264_DecCtx_t *)p_Dpb->fs_ref[uVar12],(H264_FrameStore_t *)pcVar9);
            }
            update_ref_list(p_Dpb);
            pcVar9 = (char *)0x0;
            mm_update_max_long_term_frame_idx(p_Dpb,0);
            local_48->last_has_mmco_5 = 1;
            break;
          case 6:
            if (phVar13->max_long_term_frame_idx_plus1 == 0) {
              phVar13->max_long_term_frame_idx_plus1 = p_Dpb->num_ref_frames;
            }
            uVar17 = phVar13->long_term_frame_idx;
            phVar7 = (h264_store_pic_t *)(ulong)uVar17;
            uVar15 = p->structure;
            pcVar9 = (char *)(ulong)uVar15;
            if (uVar15 == 3) {
              unmark_long_term_frame_for_reference_by_frame_idx(p_Dpb,uVar17);
              pcVar9 = (char *)phVar7;
            }
            else {
              unmark_long_term_field_for_reference_by_frame_idx(p_Dpb,uVar15,uVar17,1,p->pic_num,0);
            }
            p->is_long_term = '\x01';
            p->long_term_frame_idx = uVar17;
            iVar19 = p_Dpb->num_ref_frames;
            if (iVar19 < 2) {
              iVar19 = 1;
            }
            if ((iVar19 < (int)(p_Dpb->ref_frames_in_buffer + p_Dpb->ltref_frames_in_buffer)) &&
               (sliding_window_memory_management(p_Dpb), ((byte)h264d_debug & 4) != 0)) {
              pcVar9 = "h264d_dpb";
              _mpp_log_l(4,"h264d_dpb","Max number of reference frames exceeded",(char *)0x0);
            }
            break;
          default:
            MVar3 = MPP_NOK;
            goto LAB_0018e247;
          }
          phVar13 = phVar13->Next;
          p->dec_ref_pic_marking_buffer = phVar13;
        }
        if (local_48->last_has_mmco_5 != 0) {
          p->frame_num = 0;
          p->pic_num = 0;
          iVar19 = p->structure;
          if (iVar19 == 3) {
            p->is_mmco_5 = '\x01';
            iVar19 = p->top_poc;
            p->top_poc_mmco5 = iVar19;
            iVar11 = p->bottom_poc;
            p->bot_poc_mmco5 = iVar11;
            uVar15 = iVar19 - p->poc;
            pcVar9 = (char *)(ulong)uVar15;
            uVar17 = iVar11 - p->poc;
            iVar8 = iVar11;
            if (iVar19 < iVar11) {
              iVar8 = iVar19;
            }
            p->poc_mmco5 = iVar8;
            p->top_poc = uVar15;
            p->bottom_poc = uVar17;
            if (iVar19 <= iVar11) {
              uVar17 = uVar15;
            }
            p->poc = uVar17;
            p->frame_poc = uVar17;
          }
          else if (iVar19 == 2) {
            p->is_mmco_5 = '\x01';
            p->bot_poc_mmco5 = p->bottom_poc;
            p->bottom_poc = 0;
            p->poc = 0;
          }
          else if (iVar19 == 1) {
            p->is_mmco_5 = '\x01';
            p->top_poc_mmco5 = p->top_poc;
            p->poc = 0;
            p->top_poc = 0;
          }
          if (p->layer_id == 0) {
            MVar3 = flush_dpb(local_48->p_Dpb_layer[0],(RK_S32)pcVar9);
            if (MVar3 < MPP_OK) {
              if (((byte)h264d_debug & 4) != 0) {
                pcVar9 = "Function error(%d).\n";
                uVar18 = 0x470;
                goto LAB_0018e240;
              }
              goto LAB_0018e247;
            }
          }
          else {
            MVar3 = flush_dpb(local_48->p_Dpb_layer[1],(RK_S32)pcVar9);
            if (MVar3 < MPP_OK) {
              if (((byte)h264d_debug & 4) != 0) {
                pcVar9 = "Function error(%d).\n";
                uVar18 = 0x472;
LAB_0018e240:
                _mpp_log_l(4,"h264d_dpb",pcVar9,(char *)0x0,uVar18);
              }
LAB_0018e247:
              if (((byte)h264d_debug & 4) == 0) goto LAB_0018d525;
              pcVar9 = "Function error(%d).\n";
              uVar18 = 0x5ab;
              goto LAB_0018d51e;
            }
          }
        }
      }
    }
    else {
      MVar3 = idr_memory_management(p_Dpb,p);
      if (MVar3 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) goto LAB_0018d525;
        pcVar9 = "Function error(%d).\n";
        uVar18 = 0x5a8;
        goto LAB_0018d51e;
      }
    }
    RVar4 = get_field_dpb_combine_flag(p_Dpb->last_picture,p);
    if (RVar4 == 0) {
      if (((p->idr_flag == 0) && (p->used_for_reference != 0)) &&
         (p->adaptive_ref_pic_buffering_flag == 0)) {
        sliding_window_memory_management(p_Dpb);
        p->is_long_term = '\0';
      }
      do {
        MVar3 = remove_unused_frame_from_dpb(p_Dpb);
      } while (MVar3 == MPP_OK);
      if ((h264d_debug._1_1_ & 1) != 0) {
        _mpp_log_l(4,"h264d_dpb","before out, dpb[%d] used_size %d, size %d",(char *)0x0,
                   (ulong)(uint)p_Dpb->layer_id,(ulong)p_Dpb->used_size,p_Dpb->size);
      }
      uVar17 = p_Vid->p_Inp->max_buf_size;
      if ((uVar17 != 0) && ((h264d_debug._1_1_ & 1) != 0)) {
        _mpp_log_l(4,"h264d_dpb","max_buf_size=%d\n",(char *)0x0,(ulong)uVar17);
      }
      do {
        while( true ) {
          uVar15 = p_Dpb->used_size;
          uVar12 = (ulong)uVar15;
          if (uVar15 <= uVar17 - 1 && uVar15 < p_Dpb->size) {
            if ((h264d_debug._1_1_ & 1) != 0) {
              _mpp_log_l(4,"h264d_dpb","after out, dpb[%d] used_size %d, size %d",(char *)0x0,
                         (ulong)(uint)p_Dpb->layer_id,uVar12,p_Dpb->size);
              uVar12 = (ulong)p_Dpb->used_size;
            }
            MVar3 = insert_picture_in_dpb(p_Vid,p_Dpb->fs[uVar12],p,'\0');
            if (MPP_NOK < MVar3) {
              if (p->structure == 3) {
                phVar6 = (h264_frame_store_t *)0x0;
              }
              else {
                phVar6 = p_Dpb->fs[p_Dpb->used_size];
              }
              p_Dpb->last_picture = phVar6;
              memcpy(&p_Vid->old_pic,p,0xe0);
              p_Vid->last_pic = &p_Vid->old_pic;
              p_Dpb->used_size = p_Dpb->used_size + 1;
              if ((h264d_debug._1_1_ & 1) != 0) {
                pcVar9 = "h264d_dpb";
                _mpp_log_l(4,"h264d_dpb","[DPB_size] p_Dpb->used_size=%d",(char *)0x0);
                p = (H264_StorePic_t *)pcVar9;
              }
              if (p_Vid->p_Dec->mvc_valid == '\0') {
                scan_dpb_output(p_Dpb,p);
              }
              update_ref_list(p_Dpb);
              update_ltref_list(p_Dpb);
              return MPP_OK;
            }
            if (((byte)h264d_debug & 4) == 0) goto LAB_0018d525;
            pcVar9 = "Function error(%d).\n";
            uVar18 = 0x5e6;
            goto LAB_0018d51e;
          }
          _min_poc = (MppFrame)((ulong)_min_poc & 0xffffffff00000000);
          remove_unused_frame_from_dpb(p_Dpb);
          pHVar10 = (H264_FrameStore_t *)&min_poc;
          RVar5 = get_smallest_poc(p_Dpb,&min_poc,&local_34);
          if (p->used_for_reference == 0) break;
          if (RVar5 != 0) {
            iVar19 = p->poc;
            goto LAB_0018df04;
          }
LAB_0018df08:
          unmark_for_reference((H264_DecCtx_t *)*p_Dpb->fs,pHVar10);
          pHVar10 = *p_Dpb->fs;
          if (pHVar10->is_output == 0) {
            if (((byte)h264d_debug & 4) != 0) {
              _mpp_log_l(4,"h264d_dpb","write_stored_frame, line %d",(char *)0x0,0x5da);
              pHVar10 = *p_Dpb->fs;
            }
            MVar3 = write_stored_frame(p_Vid,p_Dpb,pHVar10);
            if (MVar3 < MPP_OK) {
              uVar18 = 0x5db;
              goto joined_r0x0018e0b3;
            }
          }
          MVar3 = remove_frame_from_dpb(p_Dpb,0);
          if (MVar3 < MPP_OK) {
            uVar18 = 0x5dd;
            goto joined_r0x0018e0b3;
          }
          p->is_long_term = '\0';
        }
        if ((RVar5 == 0) || (iVar19 = p->poc, iVar19 < min_poc)) {
          MVar3 = direct_output(p_Vid,p_Dpb,p);
          if (MPP_NOK < MVar3) {
            return MPP_OK;
          }
          uVar18 = 0x5d1;
          goto joined_r0x0018e0b3;
        }
LAB_0018df04:
        if (iVar19 < min_poc) goto LAB_0018df08;
        MVar3 = output_one_frame_from_dpb(p_Dpb);
      } while (MPP_NOK < MVar3);
      uVar18 = 0x5e0;
joined_r0x0018e0b3:
      if (((byte)h264d_debug & 4) == 0) goto LAB_0018d525;
      pcVar9 = "Function error(%d).\n";
    }
    else {
      p_00 = (H264_StorePic_t *)p_Dpb->last_picture;
      if (*(RK_U32 *)&p_00->top_field == 0) {
        MVar3 = insert_picture_in_dpb(p_Vid,(H264_FrameStore_t *)p_00,p,'\x01');
        if (MPP_NOK < MVar3) {
          scan_dpb_output(p_Dpb,p_00);
          goto LAB_0018dfc0;
        }
        if (((byte)h264d_debug & 4) == 0) goto LAB_0018d525;
        pcVar9 = "Function error(%d).\n";
        uVar18 = 0x5b3;
      }
      else {
        MVar3 = direct_output(p_Vid,p_Dpb,p);
        if (MPP_NOK < MVar3) {
LAB_0018dfc0:
          memcpy(&p_Vid->old_pic,p,0xe0);
          p_Vid->last_pic = &p_Vid->old_pic;
          p_Dpb->last_picture = (h264_frame_store_t *)0x0;
          return MPP_OK;
        }
        if (((byte)h264d_debug & 4) == 0) goto LAB_0018d525;
        pcVar9 = "Function error(%d).\n";
        uVar18 = 0x5b1;
      }
    }
  }
LAB_0018d51e:
  _mpp_log_l(4,"h264d_dpb",pcVar9,(char *)0x0,uVar18);
LAB_0018d525:
  p_mark = p->mem_mark;
  if (p_mark != (H264_DpbMark_t *)0x0) {
    if ((p_mark->out_flag == 0) || (p_mark->slot_idx < 0)) {
      if (((byte)h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_dpb","out_flag %d slot_idx %d\n",(char *)0x0,(ulong)p_mark->out_flag,
                   (ulong)(uint)p_mark->slot_idx);
      }
    }
    else {
      phVar1 = p_Vid->p_Dec;
      _min_poc = (MppFrame)0x0;
      mpp_buf_slot_get_prop(phVar1->frame_slots,p_mark->slot_idx,SLOT_FRAME_PTR,&min_poc);
      if (_min_poc != (MppFrame)0x0) {
        if ((h264d_debug._1_1_ & 0x20) != 0) {
          _mpp_log_l(4,"h264d_dpb","[DPB_BUF_FLUSH] slot_idx=%d, top_used=%d, bot_used=%d",
                     (char *)0x0,(ulong)(uint)p_mark->slot_idx,(ulong)p_mark->top_used,
                     (uint)p_mark->bot_used);
        }
        mpp_frame_set_discard(_min_poc,1);
        mpp_buf_slot_set_flag(phVar1->frame_slots,p_mark->slot_idx,SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(phVar1->frame_slots,p_mark->slot_idx,QUEUE_DISPLAY);
        mpp_buf_slot_clr_flag(phVar1->frame_slots,p_mark->slot_idx,SLOT_CODEC_USE);
        phVar1->last_frame_slot_idx = p_mark->slot_idx;
      }
      reset_dpb_mark(p_mark);
    }
  }
  return MVar3;
}

Assistant:

MPP_RET store_picture_in_dpb(H264_DpbBuf_t *p_Dpb, H264_StorePic_t *p)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dVideoCtx_t *p_Vid = p_Dpb->p_Vid;
    RK_U32 max_buf_size = 0;

    VAL_CHECK(ret, NULL != p);  //!< if frame, check for new store
    //!< set use flag
    if (p->mem_mark && (p->mem_mark->slot_idx >= 0)) {
        mpp_buf_slot_set_flag(p_Vid->p_Dec->frame_slots, p->mem_mark->slot_idx, SLOT_CODEC_USE);
    } else {
        H264D_ERR("error, p->mem_mark == NULL");
    }
    //!< deal with all frames in dpb
    p_Vid->last_has_mmco_5 = 0;
    p_Vid->last_pic_bottom_field = p->structure == BOTTOM_FIELD;
    if (p->idr_flag) {
        FUN_CHECK(ret = idr_memory_management(p_Dpb, p));
    } else {    //!< adaptive memory management
        if (p->used_for_reference && p->adaptive_ref_pic_buffering_flag) {
            FUN_CHECK(ret = adaptive_memory_management(p_Dpb, p));
        }
    }
    //!< if necessary, combine top and botteom to frame
    if (get_field_dpb_combine_flag(p_Dpb->last_picture, p)) {
        if (p_Dpb->last_picture->is_directout) {
            FUN_CHECK(ret = direct_output(p_Vid, p_Dpb, p));  //!< output frame
        } else {
            FUN_CHECK(ret = insert_picture_in_dpb(p_Vid, p_Dpb->last_picture, p, 1));  //!< field_dpb_combine
            scan_dpb_output(p_Dpb, p);
        }
        memcpy(&p_Vid->old_pic, p, sizeof(H264_StorePic_t));
        p_Vid->last_pic = &p_Vid->old_pic;
        p_Dpb->last_picture = NULL;
        goto __RETURN;
    }
    //!< sliding window
    if (!p->idr_flag && p->used_for_reference && !p->adaptive_ref_pic_buffering_flag) {
        ASSERT(!p->idr_flag);
        sliding_window_memory_management(p_Dpb);
        p->is_long_term = 0;
    }
    while (!remove_unused_frame_from_dpb(p_Dpb));
    H264D_DBG(H264D_DBG_DPB_INFO, "before out, dpb[%d] used_size %d, size %d",
              p_Dpb->layer_id, p_Dpb->used_size, p_Dpb->size);
    //!< when full output one frame or more then setting max_buf_size
    max_buf_size = p_Vid->p_Inp->max_buf_size;
    if (max_buf_size)
        H264D_DBG(H264D_DBG_DPB_INFO, "max_buf_size=%d\n", max_buf_size);
    while (p_Dpb->used_size >= p_Dpb->size ||
           (max_buf_size && p_Dpb->used_size >= max_buf_size)) {
        RK_S32 min_poc = 0, min_pos = 0;
        RK_S32 find_flag = 0;

        remove_unused_frame_from_dpb(p_Dpb);
        find_flag = get_smallest_poc(p_Dpb, &min_poc, &min_pos);
        if (!p->used_for_reference) {
            if ((!find_flag) || (p->poc < min_poc)) {
                FUN_CHECK(ret = direct_output(p_Vid, p_Dpb, p));  //!< output frame
                goto __RETURN;
            }
        }
        //!< used for reference, but not find, then flush a frame in the first
        if ((!find_flag) || (p->poc < min_poc)) {
            min_pos = 0;
            unmark_for_reference(p_Vid->p_Dec, p_Dpb->fs[min_pos]);
            if (!p_Dpb->fs[min_pos]->is_output) {
                H264D_WARNNING("write_stored_frame, line %d", __LINE__);
                FUN_CHECK(ret = write_stored_frame(p_Vid, p_Dpb, p_Dpb->fs[min_pos]));
            }
            FUN_CHECK(ret = remove_frame_from_dpb(p_Dpb, min_pos));
            p->is_long_term = 0;
        } else {
            FUN_CHECK(ret = output_one_frame_from_dpb(p_Dpb));
        }
    }
    H264D_DBG(H264D_DBG_DPB_INFO, "after out, dpb[%d] used_size %d, size %d",
              p_Dpb->layer_id, p_Dpb->used_size, p_Dpb->size);
    //!< store current decoder picture at end of dpb
    FUN_CHECK(ret = insert_picture_in_dpb(p_Vid, p_Dpb->fs[p_Dpb->used_size], p, 0));
    if (p->structure != FRAME) {
        p_Dpb->last_picture = p_Dpb->fs[p_Dpb->used_size];
    } else {
        p_Dpb->last_picture = NULL;
    }
    memcpy(&p_Vid->old_pic, p, sizeof(H264_StorePic_t));
    p_Vid->last_pic = &p_Vid->old_pic;

    p_Dpb->used_size++;
    H264D_DBG(H264D_DBG_DPB_INFO, "[DPB_size] p_Dpb->used_size=%d", p_Dpb->used_size);
    if (!p_Vid->p_Dec->mvc_valid)
        scan_dpb_output(p_Dpb, p);
    update_ref_list(p_Dpb);
    update_ltref_list(p_Dpb);

__RETURN:
    return ret = MPP_OK;
__FAILED:
    flush_one_dpb_mark(p_Vid->p_Dec, p->mem_mark);
    return ret;
}